

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

group * __thiscall
clipp::group::depth_first_traverser::innermost_blocking_group(depth_first_traverser *this)

{
  bool bVar1;
  pointer pcVar2;
  group *local_70;
  undefined1 local_38 [24];
  reverse_iterator<__gnu_cxx::__normal_iterator<const_clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>_>
  i;
  depth_first_traverser *this_local;
  
  i.current._M_current =
       (__normal_iterator<const_clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>
        )(__normal_iterator<const_clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>
          )this;
  std::
  vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ::rbegin((vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            *)&stack0xffffffffffffffe0);
  std::
  vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ::rend((vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
          *)(local_38 + 0x10));
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<clipp::group::depth_first_traverser::context_const*,std::vector<clipp::group::depth_first_traverser::context,std::allocator<clipp::group::depth_first_traverser::context>>>>,clipp::group::depth_first_traverser::innermost_blocking_group()const::_lambda(clipp::group::depth_first_traverser::context_const&)_1_>
            (&stack0xffffffffffffffe8,
             (vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
              *)&stack0xffffffffffffffe0,
             (vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
              *)(local_38 + 0x10));
  std::
  vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ::rend((vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
          *)local_38);
  bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>_>
                           *)&stack0xffffffffffffffe8,
                          (reverse_iterator<__gnu_cxx::__normal_iterator<const_clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>_>
                           *)local_38);
  if (bVar1) {
    pcVar2 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>_>
                           *)&stack0xffffffffffffffe8);
    local_70 = pcVar2->parent;
  }
  else {
    local_70 = (group *)0x0;
  }
  return local_70;
}

Assistant:

const group*
        innermost_blocking_group() const noexcept {
            auto i = std::find_if(stack_.rbegin(), stack_.rend(),
                [](const context& c) { return c.parent->blocking(); });
            return i != stack_.rend() ? i->parent : nullptr;
        }